

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool Curl_compareheader(char *headerline,char *header,char *content)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *__s;
  byte *pbVar5;
  _Bool _Var6;
  
  sVar2 = strlen(header);
  iVar1 = Curl_strncasecompare(headerline,header,sVar2);
  if (iVar1 == 0) {
    _Var6 = false;
  }
  else {
    __s = (byte *)(headerline + sVar2);
    pbVar5 = __s;
    while ((*__s != 0 && (iVar1 = Curl_isspace((uint)*__s), iVar1 != 0))) {
      __s = __s + 1;
      pbVar5 = pbVar5 + 1;
    }
    pbVar3 = (byte *)strchr((char *)__s,0xd);
    if ((pbVar3 == (byte *)0x0) && (pbVar3 = (byte *)strchr((char *)__s,10), pbVar3 == (byte *)0x0))
    {
      sVar2 = strlen((char *)__s);
      pbVar3 = __s + sVar2;
    }
    uVar4 = (long)pbVar3 - (long)pbVar5;
    sVar2 = strlen(content);
    while ((_Var6 = sVar2 <= uVar4, _Var6 &&
           (iVar1 = Curl_strncasecompare((char *)__s,content,sVar2), iVar1 == 0))) {
      uVar4 = uVar4 - 1;
      __s = __s + 1;
    }
  }
  return _Var6;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const char *content) /* content string to find */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  size_t hlen = strlen(header);
  size_t clen;
  size_t len;
  const char *start;
  const char *end;

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* doesn't start with header */

  /* pass the header */
  start = &headerline[hlen];

  /* pass all whitespace */
  while(*start && ISSPACE(*start))
    start++;

  /* find the end of the header line */
  end = strchr(start, '\r'); /* lines end with CRLF */
  if(!end) {
    /* in case there's a non-standard compliant line here */
    end = strchr(start, '\n');

    if(!end)
      /* hm, there's no line ending here, use the zero byte! */
      end = strchr(start, '\0');
  }

  len = end-start; /* length of the content part of the input line */
  clen = strlen(content); /* length of the word to find */

  /* find the content string in the rest of the line */
  for(; len >= clen; len--, start++) {
    if(strncasecompare(start, content, clen))
      return TRUE; /* match! */
  }

  return FALSE; /* no match */
}